

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-model-base-flex-estimation.hxx
# Opt level: O2

IndexedVectorArray *
stateObservation::examples::offlineModelBaseFlexEstimation
          (IndexedVectorArray *__return_storage_ptr__,IndexedVectorArray *y,IndexedVectorArray *u,
          Matrix *xh0,IndexedVectorArray *numberOfContacts,double dt,double mass,bool withForce,
          IndexedMatrixArray *Q,IndexedMatrixArray *R,Matrix3 *kfe,Matrix3 *kfv,Matrix3 *kte,
          Matrix3 *ktv,IndexedVectorArray *prediction,IndexedVectorArray *ino,
          IndexedVectorArray *premea,IndexedVectorArray *simumea,int verbose)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  Deque *this;
  TimeIndex TVar4;
  Scalar *pSVar5;
  ostream *poVar6;
  long n;
  DenseStorage<double,__1,__1,_1,_0> *other;
  long time;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_17e0 [2];
  IndexedVectorArray *local_17d0;
  Vector xhk;
  undefined1 local_1768 [16];
  ModelBaseEKFFlexEstimatorIMU estimator;
  
  local_17d0 = __return_storage_ptr__;
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ModelBaseEKFFlexEstimatorIMU(&estimator,0.005);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactModel
            ((uint)&estimator);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(dt);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setRobotMass(mass);
  sVar2 = std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(&Q->v_);
  if (sVar2 == 1) {
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::operator[]((Matrix<double,__1,__1,_0,__1,__1> *)&xhk,Q,Q->k_);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setProcessNoiseCovariance
              ((Matrix *)&estimator);
    free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  sVar2 = std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(&R->v_);
  if (sVar2 == 1) {
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::operator[]((Matrix<double,__1,__1,_0,__1,__1> *)&xhk,R,R->k_);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
    setMeasurementNoiseCovariance((Matrix *)&estimator);
    free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  sVar2 = std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(&Q->v_);
  sVar3 = std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(&R->v_);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setFlexibilityGuess
            ((Matrix *)&estimator);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces
            (SUB81(&estimator,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements
            (SUB81(&estimator,0));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator!=
                    ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)kfe,
                     (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&xhk);
  if (bVar1) {
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfe
              ((Matrix *)&estimator);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfv
              ((Matrix *)&estimator);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKte
              ((Matrix *)&estimator);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKtv
              ((Matrix *)&estimator);
  }
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(local_17d0);
  time = y->k_;
  if (0 < time) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xhk,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)xh0);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(local_17d0,&xhk,y->k_ + -1);
    free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    time = y->k_;
  }
  this = &local_17d0->v_;
  while( true ) {
    TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::getNextIndex(y);
    if (TVar4 <= time) break;
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&xhk,(TimeIndex)numberOfContacts);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xhk,0);
    round(*pSVar5);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
              ((uint)(Matrix *)&estimator);
    free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    if ((0 < verbose) && ((verbose != 1 || (time % 1000 == 0)))) {
      poVar6 = std::operator<<((ostream *)&std::cout,"iteration: ");
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      if (2 < (uint)verbose) {
        poVar6 = std::operator<<((ostream *)&std::cout,"number of contacts: ");
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&xhk,(TimeIndex)numberOfContacts);
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&xhk
                                  );
        std::endl<char,std::char_traits<char>>(poVar6);
        free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        poVar6 = std::operator<<((ostream *)&std::cout,"size of the measurement: ");
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&xhk,(TimeIndex)y);
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        poVar6 = std::operator<<(poVar6,", supposed to be ");
        stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getMeasurementSize();
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::endl<char,std::char_traits<char>>(poVar6);
        free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        poVar6 = std::operator<<((ostream *)&std::cout,"size of the input: ");
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&xhk,(TimeIndex)u);
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        poVar6 = std::operator<<(poVar6,", supposed to be ");
        stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getInputSize();
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::endl<char,std::char_traits<char>>(poVar6);
        free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        if (verbose != 3) {
          poVar6 = std::operator<<((ostream *)&std::cout,"numberOfContacts: ");
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&xhk,(TimeIndex)numberOfContacts);
          local_17e0[0] =
               (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&xhk;
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                             *)local_17e0);
          std::endl<char,std::char_traits<char>>(poVar6);
          free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
          poVar6 = std::operator<<((ostream *)&std::cout,"Measurement: ");
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&xhk,(TimeIndex)y);
          local_17e0[0] =
               (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&xhk;
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                             *)local_17e0);
          std::endl<char,std::char_traits<char>>(poVar6);
          free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
          poVar6 = std::operator<<((ostream *)&std::cout,"Input: ");
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&xhk,(TimeIndex)u);
          local_17e0[0] =
               (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&xhk;
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                             *)local_17e0);
          std::endl<char,std::char_traits<char>>(poVar6);
          free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        }
      }
    }
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_1768,(TimeIndex)y);
    n = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getMeasurementSize();
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
              ((Type *)&xhk,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1768,n);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_17e0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &xhk);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)&estimator);
    free(local_17e0[0]);
    free((void *)local_1768._0_8_);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&xhk,(TimeIndex)u);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)&estimator);
    free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    if (1 < (long)sVar2) {
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[]((Matrix<double,__1,__1,_0,__1,__1> *)&xhk,Q,time);
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
      setProcessNoiseCovariance((Matrix *)&estimator);
      free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    }
    if (1 < (long)sVar3) {
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[]((Matrix<double,__1,__1,_0,__1,__1> *)&xhk,R,time);
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
      setMeasurementNoiseCovariance((Matrix *)&estimator);
      free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    }
    other = (DenseStorage<double,__1,__1,_1,_0> *)
            stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
            getFlexibilityVector();
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&xhk,other);
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(this,(value_type *)&xhk);
    if (prediction != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getLastPrediction();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(prediction,(Matrix<double,__1,_1,_0,__1,_1> *)local_17e0,time);
      free(local_17e0[0]);
    }
    if (ino != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInnovation();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(ino,(Matrix<double,__1,_1,_0,__1,_1> *)local_17e0,time);
      free(local_17e0[0]);
    }
    if (premea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
      getLastPredictedMeasurement();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(premea,(Matrix<double,__1,_1,_0,__1,_1> *)local_17e0,time);
      free(local_17e0[0]);
    }
    if (simumea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getSimulatedMeasurement
                ();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(simumea,(Matrix<double,__1,_1,_0,__1,_1> *)local_17e0,time);
      free(local_17e0[0]);
    }
    if (1 < verbose) {
      std::operator<<((ostream *)&std::cout,"Success");
      if (verbose != 2) {
        poVar6 = std::operator<<((ostream *)&std::cout,", rebuilt state ");
        std::endl<char,std::char_traits<char>>(poVar6);
        local_17e0[0] =
             (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&xhk;
        Eigen::operator<<((ostream *)&std::cout,
                          (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                          local_17e0);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    free(xhk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    time = time + 1;
  }
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ~ModelBaseEKFFlexEstimatorIMU(&estimator);
  return local_17d0;
}

Assistant:

stateObservation::IndexedVectorArray offlineModelBaseFlexEstimation(
  const stateObservation::IndexedVectorArray & y,
  const stateObservation::IndexedVectorArray & u,
  const Matrix & xh0,
  const stateObservation::IndexedVectorArray numberOfContacts,
  double dt,
  double mass,
  bool withForce,
  const stateObservation::IndexedMatrixArray & Q,
  const stateObservation::IndexedMatrixArray & R,
  const Matrix3 & kfe,
  const Matrix3 & kfv,
  const Matrix3 & kte,
  const Matrix3 & ktv,
  IndexedVectorArray * prediction,
  IndexedVectorArray * ino,
  IndexedVectorArray * premea,
  IndexedVectorArray * simumea,
  int verbose)
{


  flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU estimator;

  estimator.setContactModel(flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::contactModel::elasticContact);
  estimator.setSamplingPeriod(dt);
  estimator.setRobotMass(mass);

  bool customQ = false,
       customR = false;

  if (Q.size()==1)
  {
    estimator.setProcessNoiseCovariance(Q[Q.getFirstIndex()]);
  }
  if (R.size()==1)
  {
    estimator.setMeasurementNoiseCovariance(R[R.getFirstIndex()]);
  }

  if (Q.size()>1)
  {
    customQ=true;
  }
  if (R.size()>1)
  {
    customR=true;
  }



//  Matrix Ri,Qi,P;
//
//  int measurementSize=6;
//  int stateSize=flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::size;
//
//  double acceleroCovariance=acc_cov_const;
//  double gyroCovariance=gyr_cov_const;
//  double posStateCov=pos_state_cov_const;
//  double oristateCov=ori_state_cov_const;
//  double velStateCov=vel_state_cov_const;
//  double angvStateCov=angv_state_cov_const;
//  double stateForceCov=state_fc_const;



//  Ri.noalias()=Matrix::Identity(measurementSize,measurementSize)*acceleroCovariance;
//  Ri(3,3)=R(4,4)=R(5,5)=gyroCovariance;
//  Qi.noalias()=Matrix::Identity(stateSize,stateSize)*posStateCov;
//
//  Qi.diagonal().segment<3>(state::ori).setConstant(oristateCov);
//
//  Qi.diagonal().segment<3>(state::linVel).setConstant(velStateCov);
//  Qi.diagonal().segment<3>(state::angVel).setConstant(angvStateCov);
//  Qi.diagonal().segment<12>(state::fc).setConstant(stateForceCov);
//
//  estimator.setProcessNoiseCovariance(Qi);
//  estimator.setMeasurementNoiseCovariance(Ri);
//  Matrix forcevariance= Matrix::Identity(6,6)*force_sensor_const;
//  forcevariance.block(3,3,3,3)=Matrix::Identity(3,3)*torque_sensor_const;
//  /// consider the vertical torque as reliable as a force
//  forcevariance(2,2)=torque_sensor_const;
//  /// consider the vertical force as reliable as torque
//  forcevariance(6,6)=force_sensor_const;
//  estimator.setForceVariance(forcevariance);



  estimator.setFlexibilityGuess(xh0);

  estimator.setWithUnmodeledForces(true);


  estimator.setWithForcesMeasurements(withForce);


  if (kfe!=Matrix3::Zero())
  {
    estimator.setKfe(kfe);
    estimator.setKfv(kfv);
    estimator.setKte(kte);
    estimator.setKtv(ktv);
  }

  ///the array of the state estimations over time
  stateObservation::IndexedVectorArray xh;
  if (y.getFirstIndex()>0)
    xh.setValue(xh0,y.getFirstIndex()-1);

  ///the reconstruction of the state
  for (TimeIndex i=y.getFirstIndex(); i<y.getNextIndex(); ++i)
  {

    estimator.setContactsNumber(unsigned(round(numberOfContacts[i](0))));

    if (verbose>0)
    {
      if (i%1000==0 || verbose >1)
      {
        std::cout << "iteration: " << i  << std::endl ;

        if (verbose >2)
        {
          std::cout << "number of contacts: "<< numberOfContacts[i]<< std::endl;
          std::cout << "size of the measurement: "<< y[i].size()
                    << ", supposed to be " << estimator.getMeasurementSize() << std::endl;
          std::cout << "size of the input: "<< u[i].size()
                    << ", supposed to be " << estimator.getInputSize() << std::endl;

          if (verbose > 3)
          {
            std::cout << "numberOfContacts: " << numberOfContacts[i].transpose() << std::endl;
            std::cout << "Measurement: " << y[i].transpose() << std::endl;
            std::cout << "Input: " << u[i].transpose() << std::endl;
          }
        }
      }
    }

    ///introduction of the measurement
    estimator.setMeasurement(Vector(y[i]).head(estimator.getMeasurementSize()));

    estimator.setMeasurementInput(u[i]);

    ///initialize flexibility
    if (customQ)
    {
      estimator.setProcessNoiseCovariance(Q[i]);
    }

    if (customR)
    {
      estimator.setMeasurementNoiseCovariance(R[i]);
    }

    ///get the estimation and give it to the array
    Vector xhk=estimator.getFlexibilityVector();

    xh.pushBack(xhk);

    if (prediction != 0x0)
    {
      prediction->setValue(estimator.getLastPrediction(),i);
    }

    if (ino != 0x0)
    {
      ino->setValue(estimator.getInnovation(),i);
    }

    if (premea != 0x0)
    {
      premea->setValue(estimator.getLastPredictedMeasurement(),i);
    }

    if (simumea != 0x0)
    {
      simumea->setValue(estimator.getSimulatedMeasurement(),i);
    }

    if (verbose >1)
    {
      std::cout << "Success";
      if (verbose >2)
      {
        std::cout << ", rebuilt state "<<std::endl;
        std::cout << xhk.transpose();
      }

      std::cout<<std::endl;

    }

  }

  return xh;
}